

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_request::tracker_request(tracker_request *this,tracker_request *param_1)

{
  bool bVar1;
  undefined6 uVar2;
  tracker_request *param_1_local;
  tracker_request *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  ::std::__cxx11::string::string((string *)&this->trackerid,(string *)&param_1->trackerid);
  ::std::shared_ptr<const_libtorrent::ip_filter>::shared_ptr(&this->filter,&param_1->filter);
  memcpy(&this->downloaded,&param_1->downloaded,0x34);
  ::std::vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>::vector
            (&this->ipv6,&param_1->ipv6);
  ::std::vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>::vector
            (&this->ipv4,&param_1->ipv4);
  memcpy(&this->info_hash,&param_1->info_hash,0x28);
  listen_socket_handle::listen_socket_handle(&this->outgoing_socket,&param_1->outgoing_socket);
  bVar1 = param_1->triggered_manually;
  uVar2 = *(undefined6 *)&param_1->field_0xf2;
  this->private_torrent = param_1->private_torrent;
  this->triggered_manually = bVar1;
  *(undefined6 *)&this->field_0xf2 = uVar2;
  this->ssl_ctx = param_1->ssl_ctx;
  this->i2pconn = param_1->i2pconn;
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT tracker_request
	{
		tracker_request() = default;

		static inline constexpr tracker_request_flags_t scrape_request = 0_bit;

		// affects interpretation of peers string in HTTP response
		// see parse_tracker_response()
		static inline constexpr tracker_request_flags_t i2p = 1_bit;

		std::string url;
		std::string trackerid;
#if TORRENT_ABI_VERSION == 1
		std::string auth;
#endif

		std::shared_ptr<const ip_filter> filter;

		std::int64_t downloaded = -1;
		std::int64_t uploaded = -1;
		std::int64_t left = -1;
		std::int64_t corrupt = 0;
		std::int64_t redundant = 0;
		std::uint16_t listen_port = 0;
		event_t event = event_t::none;
		tracker_request_flags_t kind = {};

		std::uint32_t key = 0;
		int num_want = 0;
		std::vector<address_v6> ipv6;
		std::vector<address_v4> ipv4;
		sha1_hash info_hash;
		peer_id pid;

		aux::listen_socket_handle outgoing_socket;

		// set to true if the .torrent file this tracker announce is for is marked
		// as private (i.e. has the "priv": 1 key)
		bool private_torrent = false;

		// this is set to true if this request was triggered by a "manual" call to
		// scrape_tracker() or force_reannounce()
		bool triggered_manually = false;

#if TORRENT_USE_SSL
		ssl::context* ssl_ctx = nullptr;
#endif
#if TORRENT_USE_I2P
		i2p_connection* i2pconn = nullptr;
#endif
#if TORRENT_USE_RTC
		std::vector<aux::rtc_offer> offers;
#endif
	}